

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpTcpEventLoop.cpp
# Opt level: O0

void __thiscall sznet::net::KcpTcpEventLoop::handleNewUdpMessage(KcpTcpEventLoop *this)

{
  InetAddress addr;
  bool bVar1;
  bool bVar2;
  int32_t secretId_00;
  sz_sock fd;
  LogStream *pLVar3;
  self *psVar4;
  pointer ppVar5;
  element_type *this_00;
  pointer ppVar6;
  undefined8 uVar7;
  KcpConnection *this_01;
  element_type *peVar8;
  mapped_type *this_02;
  mapped_type *this_03;
  SourceFile file;
  SourceFile file_00;
  KcpTcpEventLoop *local_2268;
  code *local_2260;
  undefined8 local_2258;
  type local_2250;
  KcpCloseCallback local_2238;
  anon_union_28_2_62076933_for_InetAddress_1 local_2218;
  undefined1 local_21f8 [8];
  KcpConnectionPtr kcpConn;
  string connName;
  undefined1 local_21c8 [40];
  char buf [256];
  _Self local_20a0;
  iterator fKcpIter;
  InetAddress local_2078;
  _Any_data local_2058;
  Logger local_2048;
  _Self local_1078;
  _Self local_1070;
  _Self local_1068;
  iterator fSecretIter;
  iterator fTcpIter;
  int inError;
  uint uStack_1048;
  bool ok;
  int32_t secretId;
  uint32_t conv;
  InetAddress local_1028;
  undefined1 local_ff8 [12];
  Logger local_fe8;
  size_t local_18;
  size_t recvSize;
  KcpTcpEventLoop *this_local;
  
  recvSize = (size_t)this;
  EventLoop::assertInLoopThread(&this->super_EventLoop);
  local_18 = Buffer::readableBytes(&this->m_inputBuffer);
  if (local_18 == 8) {
    uStack_1048 = Buffer::readInt32(&this->m_inputBuffer);
    secretId_00 = Buffer::readInt32(&this->m_inputBuffer);
    fSecretIter._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>_>_>
         ::find(&this->m_tcpConnections,&stack0xffffffffffffefb8);
    local_1068._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
         ::find(&this->m_crypts,&stack0xffffffffffffefb8);
    local_1070._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>_>_>
         ::end(&this->m_tcpConnections);
    bVar1 = std::operator==((_Self *)&fSecretIter,&local_1070);
    if (bVar1) {
      bVar1 = false;
      fTcpIter._M_node._4_4_ = 1;
    }
    else {
      ppVar5 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>_>
                             *)&fSecretIter);
      this_00 = std::
                __shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&ppVar5->second);
      bVar1 = TcpConnection::connected(this_00);
      if (bVar1) {
        local_1078._M_node =
             (_Base_ptr)
             std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::end(&this->m_crypts);
        bVar1 = std::operator==(&local_1068,&local_1078);
        if (bVar1) {
          bVar1 = false;
          fTcpIter._M_node._4_4_ = 3;
        }
        else {
          ppVar6 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_int>_>::operator->
                             (&local_1068);
          if (ppVar6->second == secretId_00) {
            fTcpIter._M_node._4_4_ = 0;
            bVar1 = true;
          }
          else {
            bVar1 = false;
            fTcpIter._M_node._4_4_ = 4;
          }
        }
      }
      else {
        bVar1 = false;
        fTcpIter._M_node._4_4_ = 2;
      }
    }
    if (bVar1) {
      local_20a0._M_node =
           (_Base_ptr)
           std::
           map<unsigned_int,_std::shared_ptr<sznet::net::KcpConnection>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::KcpConnection>_>_>_>
           ::find(&this->m_kcpConnections,&stack0xffffffffffffefb8);
      buf._248_8_ = std::
                    map<unsigned_int,_std::shared_ptr<sznet::net::KcpConnection>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::KcpConnection>_>_>_>
                    ::end(&this->m_kcpConnections);
      bVar2 = std::operator==(&local_20a0,(_Self *)(buf + 0xf8));
      if (bVar2) {
        getUdpListenIpPort_abi_cxx11_((KcpTcpEventLoop *)local_21c8);
        uVar7 = std::__cxx11::string::c_str();
        snprintf(local_21c8 + 0x20,0x100,"-kcp-%s#%d",uVar7,(ulong)uStack_1048);
        std::__cxx11::string::~string((string *)local_21c8);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &kcpConn.
                        super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,(char *)&this->m_name);
        this_01 = (KcpConnection *)operator_new(0x1f0);
        fd = Socket::fd(&this->m_udpSocket);
        KcpConnection::KcpConnection
                  (this_01,&this->super_EventLoop,fd,secretId_00,
                   (string *)
                   &kcpConn.
                    super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,uStack_1048,false,this->m_kcpMode);
        std::shared_ptr<sznet::net::KcpConnection>::shared_ptr<sznet::net::KcpConnection,void>
                  ((shared_ptr<sznet::net::KcpConnection> *)local_21f8,this_01);
        peVar8 = std::
                 __shared_ptr_access<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_21f8);
        KcpConnection::setState(peVar8,kConnecting);
        peVar8 = std::
                 __shared_ptr_access<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_21f8);
        InetAddress::InetAddress((InetAddress *)&local_2218.m_addr,&this->m_curRecvAddr);
        addr.field_0._8_4_ = local_2218._8_4_;
        addr.field_0._0_8_ = local_2218._0_8_;
        addr.field_0._12_4_ = local_2218._12_4_;
        addr.field_0._16_4_ = local_2218._16_4_;
        addr.field_0._20_8_ = local_2218._20_8_;
        KcpConnection::setPeerAddr(peVar8,addr);
        peVar8 = std::
                 __shared_ptr_access<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_21f8);
        KcpConnection::newKCP(peVar8);
        this_02 = std::
                  map<unsigned_int,_std::shared_ptr<sznet::net::KcpConnection>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::KcpConnection>_>_>_>
                  ::operator[](&this->m_kcpConnections,&stack0xffffffffffffefb8);
        std::shared_ptr<sznet::net::KcpConnection>::operator=
                  (this_02,(shared_ptr<sznet::net::KcpConnection> *)local_21f8);
        peVar8 = std::
                 __shared_ptr_access<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_21f8);
        KcpConnection::setKcpConnectionCallback(peVar8,&this->m_kcpConnectionCallback);
        peVar8 = std::
                 __shared_ptr_access<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_21f8);
        KcpConnection::setKcpMessageCallback(peVar8,&this->m_kcpMessageCallback);
        peVar8 = std::
                 __shared_ptr_access<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_21f8);
        KcpConnection::setKcpWriteCompleteCallback(peVar8,&this->m_kcpWriteCompleteCallback);
        peVar8 = std::
                 __shared_ptr_access<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_21f8);
        local_2260 = removeKcpConnectionInLoop;
        local_2258 = 0;
        local_2268 = this;
        std::
        bind<void(sznet::net::KcpTcpEventLoop::*)(std::shared_ptr<sznet::net::KcpConnection>const&,int),sznet::net::KcpTcpEventLoop*,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
                  (&local_2250,(offset_in_KcpTcpEventLoop_to_subr *)&local_2260,&local_2268,
                   (_Placeholder<1> *)&std::placeholders::_1,
                   (_Placeholder<2> *)&std::placeholders::_2);
        std::function<void(std::shared_ptr<sznet::net::KcpConnection>const&,int)>::
        function<std::_Bind<void(sznet::net::KcpTcpEventLoop::*(sznet::net::KcpTcpEventLoop*,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<sznet::net::KcpConnection>const&,int)>,void>
                  ((function<void(std::shared_ptr<sznet::net::KcpConnection>const&,int)> *)
                   &local_2238,&local_2250);
        KcpConnection::setKcpCloseCallback(peVar8,&local_2238);
        std::function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&,_int)>::~function
                  (&local_2238);
        this_03 = std::
                  unordered_map<sockaddr_in,_std::shared_ptr<sznet::net::KcpConnection>,_sznet::net::KcpTcpEventLoop::sockaddrInKeyHash,_sznet::net::KcpTcpEventLoop::sockaddrInKeyEqual,_std::allocator<std::pair<const_sockaddr_in,_std::shared_ptr<sznet::net::KcpConnection>_>_>_>
                  ::operator[](&this->m_addrConns,&this->m_curRecvAddr);
        std::shared_ptr<sznet::net::KcpConnection>::operator=
                  (this_03,(shared_ptr<sznet::net::KcpConnection> *)local_21f8);
        std::shared_ptr<sznet::net::KcpConnection>::~shared_ptr
                  ((shared_ptr<sznet::net::KcpConnection> *)local_21f8);
        std::__cxx11::string::~string
                  ((string *)
                   &kcpConn.
                    super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      checkResponse(this,bVar1);
    }
    else {
      Logger::SourceFile::SourceFile<106>
                ((SourceFile *)&local_2058,
                 (char (*) [106])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpTcpEventLoop.cpp"
                );
      file_00._12_4_ = 0;
      file_00.m_data = (char *)local_2058._M_unused._0_8_;
      file_00.m_size = local_2058._8_4_;
      Logger::Logger(&local_2048,file_00,0xd0,ERROR);
      pLVar3 = Logger::stream(&local_2048);
      psVar4 = LogStream::operator<<(pLVar3,"you are hack! [");
      pLVar3 = LogStream::operator<<(psVar4,fTcpIter._M_node._4_4_);
      psVar4 = LogStream::operator<<(pLVar3,"] from ");
      InetAddress::InetAddress((InetAddress *)((long)&fKcpIter._M_node + 4),&this->m_curRecvAddr);
      InetAddress::toIpPort_abi_cxx11_(&local_2078);
      LogStream::operator<<(psVar4,(string *)&local_2078);
      std::__cxx11::string::~string((string *)&local_2078);
      Logger::~Logger(&local_2048);
      checkResponse(this,bVar1);
    }
  }
  else {
    Logger::SourceFile::SourceFile<106>
              ((SourceFile *)local_ff8,
               (char (*) [106])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpTcpEventLoop.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_ff8._0_8_;
    file.m_size = local_ff8._8_4_;
    Logger::Logger(&local_fe8,file,0xa4,ERROR);
    pLVar3 = Logger::stream(&local_fe8);
    psVar4 = LogStream::operator<<(pLVar3,"who are you! from ");
    InetAddress::InetAddress((InetAddress *)&secretId,&this->m_curRecvAddr);
    InetAddress::toIpPort_abi_cxx11_(&local_1028);
    LogStream::operator<<(psVar4,(string *)&local_1028);
    std::__cxx11::string::~string((string *)&local_1028);
    Logger::~Logger(&local_fe8);
  }
  return;
}

Assistant:

void KcpTcpEventLoop::handleNewUdpMessage()
{
	assertInLoopThread();
	size_t recvSize = m_inputBuffer.readableBytes();
	if (recvSize != (sizeof(uint32_t) + sizeof(int32_t)))
	{
		// 这种情况不予理会
		LOG_ERROR << "who are you! from " << InetAddress(m_curRecvAddr).toIpPort();
		return;
	}
	uint32_t conv = static_cast<uint32_t>(m_inputBuffer.readInt32());
	int32_t secretId = m_inputBuffer.readInt32();
	bool ok = true;
	int inError = 0;
	TcpConnectionMap::iterator fTcpIter = m_tcpConnections.find(conv);
	cryptConvMap::iterator fSecretIter = m_crypts.find(conv);
	do
	{
		if (fTcpIter == m_tcpConnections.end())
		{
			ok = false;
			inError = 1;
			break;
		}

		if (!fTcpIter->second->connected())
		{
			ok = false;
			inError = 2;
			break;
		}

		if (fSecretIter == m_crypts.end())
		{
			ok = false;
			inError = 3;
			break;
		}

		if (fSecretIter->second != secretId)
		{
			ok = false;
			inError = 4;
			break;
		}

		inError = 0;
		ok = true;
	} while (false);
	if (!ok)
	{
		LOG_ERROR << "you are hack! [" << inError << "] from " << InetAddress(m_curRecvAddr).toIpPort();
		// 回执客户端
		checkResponse(ok);
		return;
	}
	KcpConnectionMap::iterator fKcpIter = m_kcpConnections.find(conv);
	if (fKcpIter == m_kcpConnections.end())
	{
		// 创建KcpConnection
		char buf[256];
		snprintf(buf, sizeof(buf), "-kcp-%s#%d", getUdpListenIpPort().c_str(), conv);
		string connName = m_name + buf;
		KcpConnectionPtr kcpConn(new KcpConnection(this, m_udpSocket.fd(), secretId, connName, conv, false, m_kcpMode));
		kcpConn->setState(KcpConnection::StateE::kConnecting);
		kcpConn->setPeerAddr(InetAddress(m_curRecvAddr));
		kcpConn->newKCP();
		m_kcpConnections[conv] = kcpConn;
		kcpConn->setKcpConnectionCallback(m_kcpConnectionCallback);
		kcpConn->setKcpMessageCallback(m_kcpMessageCallback);
		kcpConn->setKcpWriteCompleteCallback(m_kcpWriteCompleteCallback);
		kcpConn->setKcpCloseCallback(std::bind(&KcpTcpEventLoop::removeKcpConnectionInLoop, this, std::placeholders::_1, std::placeholders::_2));
		// 映射
		m_addrConns[m_curRecvAddr] = kcpConn;
	}
	checkResponse(ok);
}